

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *cp,OPJ_UINT32 pino,OPJ_UINT32 tileno)

{
  opj_tcp_t *poVar1;
  opj_poc_t *poVar2;
  char *__s;
  size_t sVar3;
  opj_poc_t *l_current_poc;
  opj_tcp_t *tcp;
  OPJ_UINT32 tpnum;
  OPJ_INT32 i;
  OPJ_CHAR *prog;
  OPJ_UINT32 tileno_local;
  OPJ_UINT32 pino_local;
  opj_cp_t *cp_local;
  
  tcp._0_4_ = 1;
  if (cp->tw * cp->th <= tileno) {
    __assert_fail("tileno < (cp->tw * cp->th)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6c4,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  if (cp->tcps[tileno].numpocs + 1 <= pino) {
    __assert_fail("pino < (cp->tcps[tileno].numpocs + 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6c5,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  poVar1 = cp->tcps + tileno;
  if (poVar1 == (opj_tcp_t *)0x0) {
    __assert_fail("tcp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6c9,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  poVar2 = poVar1->pocs + pino;
  if (poVar2 != (opj_poc_t *)0x0) {
    __s = opj_j2k_convert_progression_order(poVar1->prg);
    sVar3 = strlen(__s);
    if (sVar3 == 0) {
      __assert_fail("strlen(prog) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x6d0,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
    }
    if ((*(byte *)((long)&cp->m_specific_param + 0x11) >> 3 & 1) == 1) {
      for (tcp._4_4_ = 0; tcp._4_4_ < 4; tcp._4_4_ = tcp._4_4_ + 1) {
        switch(__s[tcp._4_4_]) {
        case 'C':
          tcp._0_4_ = poVar2->compE * (OPJ_UINT32)tcp;
          break;
        case 'L':
          tcp._0_4_ = poVar2->layE * (OPJ_UINT32)tcp;
          break;
        case 'P':
          tcp._0_4_ = poVar2->prcE * (OPJ_UINT32)tcp;
          break;
        case 'R':
          tcp._0_4_ = poVar2->resE * (OPJ_UINT32)tcp;
        }
        if ((uint)(cp->m_specific_param).m_enc.m_tp_flag == (int)__s[tcp._4_4_]) {
          (cp->m_specific_param).m_enc.m_tp_pos = tcp._4_4_;
          return (OPJ_UINT32)tcp;
        }
      }
    }
    else {
      tcp._0_4_ = 1;
    }
    return (OPJ_UINT32)tcp;
  }
  __assert_fail("l_current_poc != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x6cc,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
}

Assistant:

static OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *cp, OPJ_UINT32 pino,
                                     OPJ_UINT32 tileno)
{
    const OPJ_CHAR *prog = 00;
    OPJ_INT32 i;
    OPJ_UINT32 tpnum = 1;
    opj_tcp_t *tcp = 00;
    opj_poc_t * l_current_poc = 00;

    /*  preconditions */
    assert(tileno < (cp->tw * cp->th));
    assert(pino < (cp->tcps[tileno].numpocs + 1));

    /* get the given tile coding parameter */
    tcp = &cp->tcps[tileno];
    assert(tcp != 00);

    l_current_poc = &(tcp->pocs[pino]);
    assert(l_current_poc != 0);

    /* get the progression order as a character string */
    prog = opj_j2k_convert_progression_order(tcp->prg);
    assert(strlen(prog) > 0);

    if (cp->m_specific_param.m_enc.m_tp_on == 1) {
        for (i = 0; i < 4; ++i) {
            switch (prog[i]) {
            /* component wise */
            case 'C':
                tpnum *= l_current_poc->compE;
                break;
            /* resolution wise */
            case 'R':
                tpnum *= l_current_poc->resE;
                break;
            /* precinct wise */
            case 'P':
                tpnum *= l_current_poc->prcE;
                break;
            /* layer wise */
            case 'L':
                tpnum *= l_current_poc->layE;
                break;
            }
            /* whould we split here ? */
            if (cp->m_specific_param.m_enc.m_tp_flag == prog[i]) {
                cp->m_specific_param.m_enc.m_tp_pos = i;
                break;
            }
        }
    } else {
        tpnum = 1;
    }

    return tpnum;
}